

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O0

bool __thiscall
HighsSymmetryDetection::isFullOrbitope
          (HighsSymmetryDetection *this,ComponentData *componentData,HighsInt component,
          HighsSymmetries *symmetries)

{
  HighsHashTable<int,_void> *pHVar1;
  bool bVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  vector<int,_std::allocator<int>_> *this_00;
  uint *puVar6;
  int *piVar7;
  reference pvVar8;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  long *in_RDI;
  HighsInt col_1;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  HighsInt nextVertex;
  HighsInt j_1;
  HighsInt p_1;
  HighsInt k_1;
  HighsInt movePos;
  bool foundCand;
  HighsInt *prevCol;
  HighsInt *thisCol;
  bool triedLeftExtension;
  HighsInt numColsAdded;
  HighsInt jImagePos;
  HighsInt j;
  HighsInt m;
  HighsHashTable<int,_void> colSet;
  HighsInt *perm;
  HighsOrbitopeMatrix orbitopeMatrix;
  HighsInt componentNumPerms;
  HighsInt orbitopeOrbitSize;
  HighsInt orbitopeNumRows;
  HighsInt p;
  HighsInt k;
  HighsInt p0;
  HighsInt col;
  HighsInt i;
  HighsInt componentSize;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffde8;
  HighsOrbitopeMatrix *in_stack_fffffffffffffdf0;
  undefined7 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdff;
  HighsHashTable<int,_void> *in_stack_fffffffffffffe00;
  HighsInt *in_stack_fffffffffffffe10;
  HighsHashTable<int,_void> *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  int iVar9;
  undefined4 in_stack_fffffffffffffe24;
  unsigned_long *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  value_type in_stack_fffffffffffffe44;
  HighsHashTable<int,_int> *in_stack_fffffffffffffe48;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_150;
  HighsHashTable<int,_int> *local_148;
  int local_140;
  int local_13c;
  int local_138;
  int local_134;
  value_type local_130;
  byte local_129;
  int *local_128;
  HighsInt *local_120;
  byte local_115;
  int local_114;
  undefined4 local_110;
  int local_10c;
  int local_108;
  int local_104;
  HighsHashTable<int,_void> local_100;
  HighsHashTable<int,_void> *local_d8;
  undefined4 local_bc;
  int local_b8;
  int local_b4;
  HighsHashTable<int,_int> local_68;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  long local_28;
  int local_1c;
  long local_18;
  byte local_1;
  
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x48),(long)(in_EDX + 1));
  iVar9 = *pvVar3;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(local_18 + 0x48),(long)local_1c);
  local_2c = iVar9 - *pvVar3;
  if (local_2c == 1) {
    local_1 = 0;
  }
  else {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_18 + 0x48),(long)local_1c);
    for (local_30 = *pvVar3; iVar9 = local_30,
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(local_18 + 0x48),
                            (long)(local_1c + 1)), iVar9 < *pvVar3; local_30 = local_30 + 1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_18 + 0x60),(long)local_30);
      local_34 = *pvVar3;
      pvVar4 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                         ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)(*in_RDI + 0x178),
                          (long)local_34);
      if (*pvVar4 == kContinuous) {
LAB_006cac06:
        local_1 = 0;
        goto LAB_006cb70f;
      }
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x20),(long)local_34
                         );
      if ((*pvVar5 != 0.0) || (NAN(*pvVar5))) goto LAB_006cac06;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x38),(long)local_34
                         );
      if ((*pvVar5 != 1.0) || (NAN(*pvVar5))) goto LAB_006cac06;
    }
    this_00 = (vector<int,_std::allocator<int>_> *)(local_18 + 0xc0);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_18 + 0xa8),(long)local_1c);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)*pvVar3);
    local_38 = *pvVar3;
    puVar6 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(local_18 + 0xf0),
                                (long)local_38);
    if ((*puVar6 & 1) == 0) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_18 + 0xa8),(long)local_1c);
      local_3c = *pvVar3;
      do {
        local_3c = local_3c + 1;
        iVar9 = local_3c;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(local_18 + 0xa8),
                            (long)(local_1c + 1));
        if (*pvVar3 <= iVar9) {
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(local_18 + 0xf0),(long)local_38)
          ;
          local_68.numElements._4_4_ = *pvVar3 >> 1;
          local_68.numElements._0_4_ = local_2c / local_68.numElements._4_4_;
          if ((int)local_68.numElements * local_68.numElements._4_4_ != local_2c) {
            local_1 = 0;
            goto LAB_006cb70f;
          }
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(local_18 + 0xa8),
                              (long)(local_1c + 1));
          iVar9 = *pvVar3;
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(local_18 + 0xa8),(long)local_1c)
          ;
          local_68.numHashShift._4_4_ = iVar9 - *pvVar3;
          if (local_68.numHashShift._4_4_ != (int)local_68.numElements + -1) {
            local_1 = 0;
            goto LAB_006cb70f;
          }
          HighsOrbitopeMatrix::HighsOrbitopeMatrix(in_stack_fffffffffffffdf0);
          local_bc = 0xffffffff;
          std::vector<int,_std::allocator<int>_>::resize
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                     (size_type)in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
          local_b4 = local_68.numElements._4_4_;
          local_b8 = (int)local_68.numElements;
          piVar7 = std::vector<int,_std::allocator<int>_>::data
                             ((vector<int,_std::allocator<int>_> *)0x6caeec);
          local_d8 = (HighsHashTable<int,_void> *)(piVar7 + local_38 * (int)in_RDI[0x56]);
          HighsHashTable<int,_void>::HighsHashTable(in_stack_fffffffffffffe00);
          local_104 = 0;
          local_108 = 0;
          goto LAB_006caf38;
        }
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(local_18 + 0xc0),(long)local_3c);
        local_40 = *pvVar3;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(local_18 + 0xf0),(long)local_40);
        iVar9 = *pvVar3;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(local_18 + 0xf0),(long)local_38);
      } while (iVar9 == *pvVar3);
      local_1 = 0;
    }
    else {
      local_1 = 0;
    }
  }
  goto LAB_006cb70f;
LAB_006caf38:
  if ((int)in_RDI[0x56] <= local_108) goto LAB_006cb197;
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x16),
                      (long)*(int *)((long)&(local_d8->entries)._M_t.
                                            super___uniq_ptr_impl<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_HighsHashTableEntry<int,_void>_*,_HighsHashTable<int,_void>::OpNewDeleter>
                                            .
                                            super__Head_base<0UL,_HighsHashTableEntry<int,_void>_*,_false>
                                            ._M_head_impl + (long)local_108 * 4));
  local_10c = *pvVar8;
  if (local_108 < local_10c) {
    if (local_104 == local_68.numElements._4_4_) {
      local_1 = 0;
      goto LAB_006cb6e4;
    }
    iVar9 = *(int *)((long)&(local_d8->entries)._M_t.
                            super___uniq_ptr_impl<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_HighsHashTableEntry<int,_void>_*,_HighsHashTable<int,_void>::OpNewDeleter>
                            .super__Head_base<0UL,_HighsHashTableEntry<int,_void>_*,_false>.
                            _M_head_impl + (long)local_10c * 4);
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x19),(long)local_108);
    if (iVar9 != *pvVar8) {
      local_1 = 0;
      goto LAB_006cb6e4;
    }
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x19),(long)local_108);
    in_stack_fffffffffffffe44 = *pvVar8;
    in_stack_fffffffffffffe48 = &local_68;
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe48,
                        (long)local_104);
    *pvVar8 = in_stack_fffffffffffffe44;
    iVar9 = *(int *)((long)&(local_d8->entries)._M_t.
                            super___uniq_ptr_impl<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_HighsHashTableEntry<int,_void>_*,_HighsHashTable<int,_void>::OpNewDeleter>
                            .super__Head_base<0UL,_HighsHashTableEntry<int,_void>_*,_false>.
                            _M_head_impl + (long)local_108 * 4);
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe48,
                        (long)(local_b4 + local_104));
    *pvVar8 = iVar9;
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x19),(long)local_108);
    bVar2 = HighsHashTable<int,void>::insert<int&>
                      ((HighsHashTable<int,_void> *)in_stack_fffffffffffffe48,
                       (int *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
    if (!bVar2) {
      local_1 = 0;
      goto LAB_006cb6e4;
    }
    bVar2 = HighsHashTable<int,void>::insert<int_const&>
                      ((HighsHashTable<int,_void> *)in_stack_fffffffffffffe48,
                       (int *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
    in_stack_fffffffffffffe40 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffe40);
    if (!bVar2) {
      local_1 = 0;
      goto LAB_006cb6e4;
    }
    local_104 = local_104 + 1;
  }
  local_108 = local_108 + 1;
  goto LAB_006caf38;
LAB_006cb42e:
  if ((local_129 & 1) == 0) {
    local_1 = 0;
    goto LAB_006cb6e4;
  }
  for (local_13c = 0; local_13c < local_b4; local_13c = local_13c + 1) {
    in_stack_fffffffffffffe00 = local_d8;
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x16),
                        (long)local_128[local_13c]);
    pHVar1 = local_d8;
    local_140 = *(int *)((long)&(in_stack_fffffffffffffe00->entries)._M_t.
                                super___uniq_ptr_impl<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter>
                                ._M_t.
                                super__Tuple_impl<0UL,_HighsHashTableEntry<int,_void>_*,_HighsHashTable<int,_void>::OpNewDeleter>
                                .super__Head_base<0UL,_HighsHashTableEntry<int,_void>_*,_false>.
                                _M_head_impl + (long)*pvVar8 * 4);
    local_120[local_13c] = local_140;
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x16),(long)local_140);
    if (*(int *)((long)&(pHVar1->entries)._M_t.
                        super___uniq_ptr_impl<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_HighsHashTableEntry<int,_void>_*,_HighsHashTable<int,_void>::OpNewDeleter>
                        .super__Head_base<0UL,_HighsHashTableEntry<int,_void>_*,_false>._M_head_impl
                + (long)*pvVar8 * 4) != local_128[local_13c]) {
      local_1 = 0;
      goto LAB_006cb6e4;
    }
    in_stack_fffffffffffffdff =
         HighsHashTable<int,void>::insert<int&>
                   ((HighsHashTable<int,_void> *)in_stack_fffffffffffffe48,
                    (int *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
    if (!(bool)in_stack_fffffffffffffdff) {
      local_1 = 0;
      goto LAB_006cb6e4;
    }
  }
  local_114 = local_114 + 1;
  goto LAB_006cb1aa;
LAB_006cb197:
  local_114 = 2;
  local_115 = 0;
LAB_006cb1aa:
  if (local_114 < local_b8) {
    in_stack_fffffffffffffe38 = (unsigned_long *)HighsHashTable<int,_void>::size(&local_100);
    if (in_stack_fffffffffffffe38 == (unsigned_long *)(long)(local_114 * local_b4)) {
      local_120 = HighsOrbitopeMatrix::operator()
                            (in_stack_fffffffffffffdf0,
                             (HighsInt)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                             (HighsInt)in_stack_fffffffffffffde8);
      local_128 = HighsOrbitopeMatrix::operator()
                            (in_stack_fffffffffffffdf0,
                             (HighsInt)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                             (HighsInt)in_stack_fffffffffffffde8);
      local_129 = 0;
      do {
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x16),(long)*local_128);
        local_130 = *pvVar8;
        local_d8 = (HighsHashTable<int,_void> *)0x0;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(local_18 + 0xa8),(long)local_1c);
        local_134 = *pvVar3;
        do {
          local_134 = local_134 + 1;
          iVar9 = local_134;
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(local_18 + 0xa8),
                              (long)(local_1c + 1));
          if (*pvVar3 <= iVar9) goto LAB_006cb3e6;
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(local_18 + 0xc0),(long)local_134
                             );
          local_138 = *pvVar3;
          piVar7 = std::vector<int,_std::allocator<int>_>::data
                             ((vector<int,_std::allocator<int>_> *)0x6cb333);
          local_d8 = (HighsHashTable<int,_void> *)(piVar7 + local_138 * (int)in_RDI[0x56]);
          iVar9 = *(int *)((long)&(local_d8->entries)._M_t.
                                  super___uniq_ptr_impl<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_HighsHashTableEntry<int,_void>_*,_HighsHashTable<int,_void>::OpNewDeleter>
                                  .super__Head_base<0UL,_HighsHashTableEntry<int,_void>_*,_false>.
                                  _M_head_impl + (long)local_130 * 4);
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x19),(long)local_130);
        } while ((iVar9 == *pvVar8) ||
                (in_stack_fffffffffffffe18 =
                      (HighsHashTable<int,_void> *)
                      HighsHashTable<int,_void>::find
                                (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10),
                in_stack_fffffffffffffe18 != (HighsHashTable<int,_void> *)0x0));
        local_129 = 1;
LAB_006cb3e6:
        if (((local_129 & 1) != 0) || ((local_115 & 1) != 0)) goto LAB_006cb42e;
        in_stack_fffffffffffffe10 =
             HighsOrbitopeMatrix::operator()
                       (in_stack_fffffffffffffdf0,
                        (HighsInt)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                        (HighsInt)in_stack_fffffffffffffde8);
        local_115 = 1;
        local_128 = in_stack_fffffffffffffe10;
      } while( true );
    }
    local_1 = 0;
  }
  else {
    in_stack_fffffffffffffdf0 = (HighsOrbitopeMatrix *)HighsHashTable<int,_void>::size(&local_100);
    if (in_stack_fffffffffffffdf0 == (HighsOrbitopeMatrix *)(long)local_2c) {
      local_148 = &local_68;
      local_150._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffde8);
      std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffde8);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )in_stack_fffffffffffffdf0,
                                (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )in_stack_fffffffffffffde8), bVar2) {
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                  (&local_150);
        in_stack_fffffffffffffde8 = (vector<int,_std::allocator<int>_> *)(local_28 + 0xa8);
        std::vector<HighsOrbitopeMatrix,_std::allocator<HighsOrbitopeMatrix>_>::size
                  ((vector<HighsOrbitopeMatrix,_std::allocator<HighsOrbitopeMatrix>_> *)
                   (local_28 + 0x90));
        HighsHashTable<int,int>::insert<int&,unsigned_long>
                  (in_stack_fffffffffffffe48,
                   (int *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                   in_stack_fffffffffffffe38);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&local_150);
      }
      std::vector<HighsOrbitopeMatrix,_std::allocator<HighsOrbitopeMatrix>_>::
      emplace_back<HighsOrbitopeMatrix>
                ((vector<HighsOrbitopeMatrix,_std::allocator<HighsOrbitopeMatrix>_> *)
                 in_stack_fffffffffffffe00,
                 (HighsOrbitopeMatrix *)
                 CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
      local_1 = 1;
    }
    else {
      local_1 = 0;
    }
  }
LAB_006cb6e4:
  local_110 = 1;
  HighsHashTable<int,_void>::~HighsHashTable((HighsHashTable<int,_void> *)in_stack_fffffffffffffdf0)
  ;
  HighsOrbitopeMatrix::~HighsOrbitopeMatrix(in_stack_fffffffffffffdf0);
LAB_006cb70f:
  return (bool)(local_1 & 1);
}

Assistant:

bool HighsSymmetryDetection::isFullOrbitope(const ComponentData& componentData,
                                            HighsInt component,
                                            HighsSymmetries& symmetries) {
  HighsInt componentSize = componentData.componentStarts[component + 1] -
                           componentData.componentStarts[component];
  if (componentSize == 1) return false;

  // check that component acts only on binary variables
  for (HighsInt i = componentData.componentStarts[component];
       i < componentData.componentStarts[component + 1]; ++i) {
    HighsInt col = componentData.componentSets[i];
    if (model->integrality_[col] == HighsVarType::kContinuous ||
        model->col_lower_[col] != 0.0 || model->col_upper_[col] != 1.0)
      return false;
  }

  // check that the number of unfixed variables in the first permutation is even
  HighsInt p0 =
      componentData
          .permComponents[componentData.permComponentStarts[component]];
  if (componentData.numUnfixed[p0] & 1) return false;

  // check that the other permutations in the component have the same number of
  // unfixed variables as the first one
  for (HighsInt k = componentData.permComponentStarts[component] + 1;
       k < componentData.permComponentStarts[component + 1]; ++k) {
    HighsInt p = componentData.permComponents[k];
    if (componentData.numUnfixed[p] != componentData.numUnfixed[p0]) {
      // printf("number of unfixed cols in perm %d: %d\n", p,
      //       componentData.numUnfixed[p]);
      // printf("wrong number of unfixed columns in permutation\n");
      return false;
    }
  }

  // all unfixed variables in the permutation must be part of a two cycle
  // and each two cycle defines one row of the orbitope. Hence the number
  // of unfixed variables in each permutation must be even and the number of
  // rows is the number of unfixed variables divided by two
  HighsInt orbitopeNumRows = componentData.numUnfixed[p0] >> 1;

  // if this component is a full orbitope the component size must be
  // divisible by the number of orbits and the result is the size of each
  // orbit
  HighsInt orbitopeOrbitSize = componentSize / orbitopeNumRows;
  if (orbitopeOrbitSize * orbitopeNumRows != componentSize) {
    // printf("wrong number of orbits (%d orbits for component of size %d)\n",
    //        orbitopeNumRows, componentSize);
    return false;
  }

  // the number of permutations must be n-1 where n is the size of the
  // orbits in the orbitope
  HighsInt componentNumPerms =
      componentData.permComponentStarts[component + 1] -
      componentData.permComponentStarts[component];
  if (componentNumPerms != (orbitopeOrbitSize - 1)) {
    // printf("wrong number of perms\n");
    return false;
  }

  // set up the first two columns of the orbitope matrix based on the first
  // permutation.
  HighsOrbitopeMatrix orbitopeMatrix;
  orbitopeMatrix.matrix.resize(componentSize, -1);
  orbitopeMatrix.numRows = orbitopeNumRows;
  orbitopeMatrix.rowLength = orbitopeOrbitSize;
  assert(componentSize == orbitopeMatrix.numRows * orbitopeMatrix.rowLength);

  const HighsInt* perm = symmetries.permutations.data() + p0 * numActiveCols;
  HighsHashTable<HighsInt> colSet;
  HighsInt m = 0;
  for (HighsInt j = 0; j < numActiveCols; ++j) {
    HighsInt jImagePos = vertexPosition[perm[j]];
    if (jImagePos <= j) continue;
    if (m == orbitopeNumRows) return false;

    // permutation should consist of two cycles
    if (perm[jImagePos] != vertexGroundSet[j]) return false;

    orbitopeMatrix.matrix[m] = vertexGroundSet[j];
    orbitopeMatrix.matrix[orbitopeMatrix.numRows + m] = perm[j];

    // Remember set of variables of the orbtiope matrix. Each variable should
    // occur only once, otherwise the permutation do not work out. Since we

    if (!colSet.insert(vertexGroundSet[j])) return false;
    if (!colSet.insert(perm[j])) return false;
    ++m;
  }

  // printf("set up first two columns of possible orbitope with permutation
  // %d\n",
  //        p0);

  HighsInt numColsAdded = 2;
  bool triedLeftExtension = false;

  while (numColsAdded < orbitopeMatrix.rowLength) {
    if (colSet.size() != numColsAdded * orbitopeMatrix.numRows) return false;

    HighsInt* thisCol = &orbitopeMatrix(0, numColsAdded);
    HighsInt* prevCol = &orbitopeMatrix(0, numColsAdded - 1);

    bool foundCand = false;

    while (true) {
      HighsInt movePos = vertexPosition[prevCol[0]];
      perm = nullptr;

      for (HighsInt k = componentData.permComponentStarts[component] + 1;
           k < componentData.permComponentStarts[component + 1]; ++k) {
        HighsInt p = componentData.permComponents[k];
        perm = symmetries.permutations.data() + p * numActiveCols;

        if (perm[movePos] != vertexGroundSet[movePos] &&
            !colSet.find(perm[movePos])) {
          foundCand = true;
          break;
        }
      }

      if (!foundCand && !triedLeftExtension) {
        // if we fail to find a permutation extending the last column directly
        // after we set up the first two columns we might try to extend column
        // zero instead of the previous one
        prevCol = &orbitopeMatrix(0, 0);
        triedLeftExtension = true;
        continue;
      }

      break;
    }

    if (!foundCand) {
      // printf("did not find next permutation moving col %d\n", prevCol[0]);
      return false;
    }

    for (HighsInt j = 0; j < orbitopeMatrix.numRows; ++j) {
      HighsInt nextVertex = perm[vertexPosition[prevCol[j]]];

      thisCol[j] = nextVertex;

      // check if this is a two cycle
      if (perm[vertexPosition[nextVertex]] != prevCol[j]) return false;

      if (!colSet.insert(thisCol[j])) {
        // printf("col already exists\n");
        return false;
      }
    }

    ++numColsAdded;
  }

  if (colSet.size() != componentSize) {
    // printf("not all columns of component are mapped\n");
    return false;
  }

  for (HighsInt col : orbitopeMatrix.matrix)
    symmetries.columnToOrbitope.insert(col, symmetries.orbitopes.size());

  symmetries.orbitopes.emplace_back(std::move(orbitopeMatrix));

  // printf("component %d is full orbitope: size %d and %d orbits\n", component,
  //        componentSize, componentData.componentNumOrbits[component]);
  return true;
}